

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O0

void __thiscall QtMWidgets::PageViewPrivate::layoutControl(PageViewPrivate *this,QRect *r)

{
  PageControl *pPVar1;
  int iVar2;
  int iVar3;
  QPoint local_34;
  QPoint local_2c;
  int local_24;
  int y;
  QSize controlSize;
  QRect *r_local;
  PageViewPrivate *this_local;
  
  controlSize = (QSize)r;
  iVar2 = QRect::width(r);
  pPVar1 = this->control;
  iVar3 = QRect::width((QRect *)controlSize);
  iVar3 = (**(code **)(*(long *)pPVar1 + 0x80))(pPVar1,iVar3);
  QSize::QSize((QSize *)&stack0xffffffffffffffe0,iVar2,iVar3);
  local_2c = QRect::bottomLeft((QRect *)controlSize);
  iVar3 = QPoint::y(&local_2c);
  iVar2 = this->controlOffset;
  local_24 = QSize::height((QSize *)&stack0xffffffffffffffe0);
  local_24 = (iVar3 - iVar2) - local_24;
  QWidget::resize((QSize *)this->control);
  pPVar1 = this->control;
  local_34 = QRect::topLeft((QRect *)controlSize);
  iVar2 = QPoint::x(&local_34);
  QWidget::move(&pPVar1->super_QWidget,iVar2,local_24);
  return;
}

Assistant:

void
PageViewPrivate::layoutControl( const QRect & r )
{
	const QSize controlSize = QSize( r.width(),
		control->heightForWidth( r.width() ) );

	const int y = r.bottomLeft().y() - controlOffset - controlSize.height();

	control->resize( controlSize );

	control->move( r.topLeft().x(), y );
}